

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeSorterCompare(VdbeCursor *pCsr,Mem *pVal,int nKeyCol,int *pRes)

{
  VdbeSorter *pSorter_00;
  void *pvVar1;
  UnpackedRecord *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  KeyInfo *in_RDI;
  int nKey;
  void *pKey;
  int i;
  KeyInfo *pKeyInfo;
  UnpackedRecord *r2;
  VdbeSorter *pSorter;
  void *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar2;
  UnpackedRecord *local_38;
  undefined4 in_stack_ffffffffffffffe0;
  int nKey1;
  
  iVar2 = (int)((ulong)in_RSI >> 0x20);
  pSorter_00 = *(VdbeSorter **)&in_RDI[1].nAllField;
  local_38 = pSorter_00->pUnpacked;
  if (local_38 == (UnpackedRecord *)0x0) {
    local_38 = sqlite3VdbeAllocUnpackedRecord
                         ((KeyInfo *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    pSorter_00->pUnpacked = local_38;
    if (local_38 == (UnpackedRecord *)0x0) {
      return 7;
    }
    local_38->nField = (u16)in_EDX;
  }
  pvVar1 = vdbeSorterRowkey(pSorter_00,(int *)&stack0xffffffffffffffac);
  nKey1 = (int)((ulong)pvVar1 >> 0x20);
  sqlite3VdbeRecordUnpack(in_RDI,iVar2,(void *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX);
  iVar2 = 0;
  while( true ) {
    if (in_EDX <= iVar2) {
      iVar2 = sqlite3VdbeRecordCompare(nKey1,in_stack_ffffffffffffffa8,(UnpackedRecord *)0x16a714);
      *(int *)&in_RCX->pKeyInfo = iVar2;
      return 0;
    }
    if ((local_38->aMem[iVar2].flags & 1) != 0) break;
    iVar2 = iVar2 + 1;
  }
  *(undefined4 *)&in_RCX->pKeyInfo = 0xffffffff;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterCompare(
  const VdbeCursor *pCsr,         /* Sorter cursor */
  Mem *pVal,                      /* Value to compare to current sorter key */
  int nKeyCol,                    /* Compare this many columns */
  int *pRes                       /* OUT: Result of comparison */
){
  VdbeSorter *pSorter;
  UnpackedRecord *r2;
  KeyInfo *pKeyInfo;
  int i;
  void *pKey; int nKey;           /* Sorter key to compare pVal with */

  assert( pCsr->eCurType==CURTYPE_SORTER );
  pSorter = pCsr->uc.pSorter;
  r2 = pSorter->pUnpacked;
  pKeyInfo = pCsr->pKeyInfo;
  if( r2==0 ){
    r2 = pSorter->pUnpacked = sqlite3VdbeAllocUnpackedRecord(pKeyInfo);
    if( r2==0 ) return SQLITE_NOMEM_BKPT;
    r2->nField = nKeyCol;
  }
  assert( r2->nField==nKeyCol );

  pKey = vdbeSorterRowkey(pSorter, &nKey);
  sqlite3VdbeRecordUnpack(pKeyInfo, nKey, pKey, r2);
  for(i=0; i<nKeyCol; i++){
    if( r2->aMem[i].flags & MEM_Null ){
      *pRes = -1;
      return SQLITE_OK;
    }
  }

  *pRes = sqlite3VdbeRecordCompare(pVal->n, pVal->z, r2);
  return SQLITE_OK;
}